

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::unserialize_helper<serialization::json_iarchive,Person>
               (json_iarchive *ar,vector<Person,_std::allocator<Person>_> *v)

{
  size_type sVar1;
  size_type i;
  Person tmp;
  Person local_58;
  
  sVar1 = json_iarchive::load_sequence_start(ar);
  std::vector<Person,_std::allocator<Person>_>::reserve(v,(ulong)sVar1);
  for (i = 0; sVar1 != i; i = i + 1) {
    json_iarchive::load_sequence_item_start(ar,i);
    local_58.name._M_string_length = 0;
    local_58.name.field_2._M_local_buf[0] = '\0';
    local_58.name._M_dataplus._M_p = (pointer)&local_58.name.field_2;
    unserialize_helper<serialization::json_iarchive,Person>(ar,&local_58);
    std::vector<Person,_std::allocator<Person>_>::emplace_back<Person>(v,&local_58);
    json_iarchive::load_sequence_item_end(ar);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}